

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_arithmetic.c
# Opt level: O0

mask_t gf_25519_isr(gf_25519_s *a,gf_25519_s *x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  gf_25519_s *b;
  mask_t mVar7;
  mask_t mVar8;
  mask_t qr;
  mask_t succ;
  mask_t one;
  gf_25519_t L3;
  gf_25519_t L2;
  gf_25519_t L1;
  gf_25519_t L0;
  gf_25519_t tmp_7;
  gf_25519_t tmp_6;
  gf_25519_t tmp_5;
  gf_25519_t tmp_4;
  gf_25519_t tmp_3;
  gf_25519_t tmp_2;
  gf_25519_t tmp_1;
  gf_25519_t tmp;
  big_register_t br_mask;
  word_t k;
  uchar *bFalse;
  uchar *bTrue;
  uchar *a_1;
  big_register_t ret;
  uint32_t y;
  gf_25519_s *in_stack_fffffffffffffb18;
  gf_25519_s *b_00;
  gf_25519_s *in_stack_fffffffffffffb20;
  uint local_4a0 [16];
  gf_25519_s local_460;
  gf_25519_s *in_stack_fffffffffffffbf0;
  gf_25519_s *in_stack_fffffffffffffbf8;
  gf_25519_s *in_stack_fffffffffffffc08;
  gf_25519_s *in_stack_fffffffffffffc10;
  gf_25519_s *in_stack_fffffffffffffc18;
  int local_374;
  int local_314;
  int local_2b4;
  int local_254;
  int local_1f4;
  int local_194;
  int local_134;
  int local_c4;
  ulong local_a0;
  uint uStack_38;
  
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_c4 = 2; local_c4 != 0; local_c4 = local_c4 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_134 = 4; local_134 != 0; local_134 = local_134 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_194 = 10; local_194 != 0; local_194 = local_194 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_1f4 = 0x18; local_1f4 != 0; local_1f4 = local_1f4 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_254 = 0x18; local_254 != 0; local_254 = local_254 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_2b4 = 0x30; local_2b4 != 0; local_2b4 = local_2b4 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_314 = 0x7c; local_314 != 0; local_314 = local_314 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  for (local_374 = 0; local_374 != 0; local_374 = local_374 + -2) {
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_sqr(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  gf_25519_add(&local_460,(gf_25519_s *)&stack0xfffffffffffffb20,gf_25519_ONE);
  b = (gf_25519_s *)gf_25519_eq(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  b_00 = b;
  mVar7 = gf_25519_eq(in_stack_fffffffffffffb20,b);
  mVar8 = gf_25519_eq(in_stack_fffffffffffffb20,b_00);
  uStack_38 = (uint)b_00 | (uint)mVar8;
  for (local_a0 = 0; local_a0 < 0x31; local_a0 = local_a0 + 0x10) {
    uVar1 = *(uint *)((long)gf_25519_ONE[0].limb + local_a0 + 4);
    uVar2 = *(uint *)((long)gf_25519_ONE[0].limb + local_a0 + 8);
    uVar3 = *(uint *)((long)gf_25519_ONE[0].limb + local_a0 + 0xc);
    uVar4 = *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + local_a0 + 4);
    uVar5 = *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + local_a0 + 8);
    uVar6 = *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + local_a0 + 0xc);
    *(uint *)((long)local_4a0 + local_a0) =
         uStack_38 & *(uint *)((long)gf_25519_ONE[0].limb + local_a0) |
         (uStack_38 ^ 0xffffffff) & *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + local_a0);
    *(uint *)((long)local_4a0 + local_a0 + 4) = uStack_38 & uVar1 | (uStack_38 ^ 0xffffffff) & uVar4
    ;
    *(uint *)((long)local_4a0 + local_a0 + 8) = uStack_38 & uVar2 | (uStack_38 ^ 0xffffffff) & uVar5
    ;
    *(uint *)((long)local_4a0 + local_a0 + 0xc) =
         uStack_38 & uVar3 | (uStack_38 ^ 0xffffffff) & uVar6;
  }
  gf_25519_mul(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  return (ulong)b | mVar7;
}

Assistant:

mask_t gf_isr (gf a, const gf x) {
    gf L0, L1, L2, L3;
    
    gf_sqr (L0, x);
    gf_mul (L1, L0, x);
    gf_sqr (L0, L1);
    gf_mul (L1, L0, x);
    gf_sqrn(L0, L1, 3);
    gf_mul (L2, L0, L1);
    gf_sqrn(L0, L2, 6);
    gf_mul (L1, L2, L0);
    gf_sqr (L2, L1);
    gf_mul (L0, L2, x);
    gf_sqrn(L2, L0, 12);
    gf_mul (L0, L2, L1);
    gf_sqrn(L2, L0, 25);
    gf_mul (L3, L2, L0);
    gf_sqrn(L2, L3, 25);
    gf_mul (L1, L2, L0);    
    gf_sqrn(L2, L1, 50);
    gf_mul (L0, L2, L3);
    gf_sqrn(L2, L0, 125);
    gf_mul (L3, L2, L0);
    gf_sqrn(L2, L3, 2);
    gf_mul (L0, L2, x);

    gf_sqr (L2, L0);
    gf_mul (L3, L2, x);
    gf_add(L1,L3,ONE);
    mask_t one = gf_eq(L3,ONE);
    mask_t succ = one | gf_eq(L1,ZERO);
    mask_t qr   = one | gf_eq(L3,SQRT_MINUS_ONE);
    
    constant_time_select(L2, SQRT_MINUS_ONE, ONE, sizeof(L2), qr, 0);
    gf_mul (a,L2,L0);
    return succ;
}